

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O0

void ravi_code_typecoersion(LexState *ls,int reg,ravi_type_map tm,TString *typename)

{
  FuncState *fs;
  uint bc;
  OpCode OVar1;
  TString *typename_local;
  ravi_type_map tm_local;
  int reg_local;
  LexState *ls_local;
  
  if ((tm == 0x10) || (tm == 8)) {
    OVar1 = OP_RAVI_TOINT;
    if (tm == 0x10) {
      OVar1 = OP_RAVI_TOFLT;
    }
    luaK_codeABC(ls->fs,OVar1,reg,0,0);
  }
  else if ((tm == 0x20) || (tm == 0x40)) {
    OVar1 = OP_RAVI_TOFARRAY;
    if (tm == 0x20) {
      OVar1 = OP_RAVI_TOIARRAY;
    }
    luaK_codeABC(ls->fs,OVar1,reg,0,0);
  }
  else if (tm == 0x80) {
    luaK_codeABC(ls->fs,OP_RAVI_TOTAB,reg,0,0);
  }
  else if (tm == 0x401) {
    fs = ls->fs;
    bc = luaK_stringK(ls->fs,typename);
    luaK_codeABx(fs,OP_RAVI_TOTYPE,reg,bc);
  }
  else if (tm == 0x101) {
    luaK_codeABC(ls->fs,OP_RAVI_TOSTRING,reg,0,0);
  }
  else if (tm == 0x201) {
    luaK_codeABC(ls->fs,OP_RAVI_TOCLOSURE,reg,0,0);
  }
  return;
}

Assistant:

static void ravi_code_typecoersion(LexState *ls, int reg, ravi_type_map tm,
                                   TString *typename /* only if tt is USERDATA */) {
  /* do we need to convert ? */
  if (tm == RAVI_TM_FLOAT || tm == RAVI_TM_INTEGER)
    /* code an instruction to convert in place */
    luaK_codeABC(ls->fs, tm == RAVI_TM_FLOAT ? OP_RAVI_TOFLT : OP_RAVI_TOINT, reg, 0, 0);
  else if (tm == RAVI_TM_INTEGER_ARRAY || tm == RAVI_TM_FLOAT_ARRAY)
    luaK_codeABC(ls->fs, tm == RAVI_TM_INTEGER_ARRAY ? OP_RAVI_TOIARRAY : OP_RAVI_TOFARRAY, reg, 0, 0);
  else if (tm == RAVI_TM_TABLE)
    luaK_codeABC(ls->fs, OP_RAVI_TOTAB, reg, 0, 0);
  else if (tm == RAVI_TM_USERDATA_OR_NIL)
    luaK_codeABx(ls->fs, OP_RAVI_TOTYPE, reg, luaK_stringK(ls->fs, typename));
  else if (tm == RAVI_TM_STRING_OR_NIL)
    luaK_codeABC(ls->fs, OP_RAVI_TOSTRING, reg, 0, 0);
  else if (tm == RAVI_TM_FUNCTION_OR_NIL)
    luaK_codeABC(ls->fs, OP_RAVI_TOCLOSURE, reg, 0, 0);
  // TODO coerse to boolean
}